

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O2

void __thiscall
poplar::compact_bonsai_nlm<int,_64UL>::show_stats
          (compact_bonsai_nlm<int,_64UL> *this,ostream *os,int n)

{
  string indent;
  unsigned_long local_40;
  string local_38;
  
  get_indent_abi_cxx11_(&local_38,(poplar *)(ulong)(uint)n,n);
  show_stat<char[19]>(os,&local_38,"name",(char (*) [19])"compact_bonsai_nlm");
  local_40 = this->size_;
  show_stat<unsigned_long>(os,&local_38,"size",&local_40);
  local_40 = (long)(this->ptrs_).
                   super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ptrs_).
                   super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  show_stat<unsigned_long>(os,&local_38,"num_ptrs",&local_40);
  local_40 = alloc_bytes(this);
  show_stat<unsigned_long>(os,&local_38,"alloc_bytes",&local_40);
  local_40 = 0x40;
  show_stat<unsigned_long>(os,&local_38,"chunk_size",&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_bonsai_nlm");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "num_ptrs", num_ptrs());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "max_length", max_length_);
        show_stat(os, indent, "ave_length", double(sum_length_) / size());
#endif
        show_stat(os, indent, "chunk_size", ChunkSize);
    }